

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

token * get_next_token(token *__return_storage_ptr__,iit *iter,iit *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  token *e;
  char *pcVar7;
  token retval;
  TokenType local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _Alloc_hider local_50;
  char *local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_50._M_p = &local_40;
  local_68 = 0;
  local_48 = (char *)0x0;
  local_40 = '\0';
  bVar5 = skip_space(iter,end);
  if (bVar5) {
    pcVar3 = iter->_M_current;
    uStack_60 = SUB84(pcVar3,0);
    uStack_5c = (undefined4)((ulong)pcVar3 >> 0x20);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x102030);
    cVar2 = *iter->_M_current;
    if (cVar2 == '(') {
      local_68 = 5;
    }
    else if (cVar2 == ')') {
      local_68 = 6;
    }
    else if (cVar2 == ';') {
      local_68 = 4;
    }
    if (local_68 == 0) {
      pcVar7 = iter->_M_current;
      while (pcVar4 = end->_M_current, pcVar7 != pcVar4) {
        cVar2 = *pcVar7;
        iVar6 = isalnum((int)cVar2);
        if ((iVar6 == 0) && (cVar2 != '_')) break;
        std::__cxx11::string::push_back((char)&local_50);
        pcVar7 = iter->_M_current + 1;
        iter->_M_current = pcVar7;
      }
      if (pcVar7 == pcVar3) {
        __return_storage_ptr__->toktype = tokEOF;
        (__return_storage_ptr__->start_iter)._M_current = (char *)0x0;
        (__return_storage_ptr__->end_iter)._M_current = (char *)0x0;
        (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->lexeme).field_2;
        (__return_storage_ptr__->lexeme)._M_string_length = 0;
        (__return_storage_ptr__->lexeme).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->start_iter)._M_current = pcVar4;
        (__return_storage_ptr__->end_iter)._M_current = pcVar4;
        goto LAB_001019ba;
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar6 == 0) {
        local_68 = tokVar;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar6 == 0) {
          local_68 = tokFunc;
        }
        else {
          local_68 = tokIdent;
        }
      }
      (__return_storage_ptr__->end_iter)._M_current = iter->_M_current;
      __return_storage_ptr__->toktype = local_68;
      *(ulong *)&__return_storage_ptr__->field_0x4 = CONCAT44(uStack_60,uStack_64);
      *(undefined4 *)((long)&(__return_storage_ptr__->start_iter)._M_current + 4) = uStack_5c;
    }
    else {
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,0,(ulong)local_48,'\x01');
      pcVar7 = iter->_M_current;
      iter->_M_current = pcVar7 + 1;
      (__return_storage_ptr__->end_iter)._M_current = pcVar7 + 1;
      *(ulong *)__return_storage_ptr__ = CONCAT44(uStack_64,local_68);
      (__return_storage_ptr__->start_iter)._M_current = pcVar3;
    }
    paVar1 = &(__return_storage_ptr__->lexeme).field_2;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p = (pointer)paVar1;
    if (local_50._M_p == &local_40) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)((long)&(__return_storage_ptr__->lexeme).field_2 + 8) = uStack_38;
    }
    else {
      (__return_storage_ptr__->lexeme)._M_dataplus._M_p = local_50._M_p;
      (__return_storage_ptr__->lexeme).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    }
    (__return_storage_ptr__->lexeme)._M_string_length = (size_type)local_48;
    local_48 = (char *)0x0;
    local_40 = '\0';
    local_50._M_p = &local_40;
  }
  else {
    pcVar3 = end->_M_current;
    __return_storage_ptr__->toktype = tokEOF;
    (__return_storage_ptr__->start_iter)._M_current = (char *)0x0;
    (__return_storage_ptr__->end_iter)._M_current = (char *)0x0;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    (__return_storage_ptr__->lexeme)._M_string_length = 0;
    (__return_storage_ptr__->lexeme).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->start_iter)._M_current = pcVar3;
    (__return_storage_ptr__->end_iter)._M_current = pcVar3;
  }
LAB_001019ba:
  if (local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

token get_next_token(iit &iter, iit &end) {
    token retval;
    
    if (! skip_space(iter, end)) {
        return token::mkend(end);
    }
    
    // skip_space guarantees we are not at the end of 
    // input but are at a non-space character.
    
    retval.start_iter = iter;
    retval.lexeme = "";
    
    // check punctuation first
    switch (*iter) {
        case ';' : retval.toktype = tokSemi; break;
        case '(' : retval.toktype = tokOpenParen; break;
        case ')' : retval.toktype = tokCloseParen; break;
    };
    
    if (retval.toktype != tokNil) {
        retval.lexeme = *iter;
        retval.end_iter = ++iter;
        return retval;
    }
    
    while (iter != end) {
        if (std::isalnum(*iter))
            retval.lexeme += *iter;
        else if (*iter == '_')
            retval.lexeme += '_';
        else
            break;
        
        ++iter;
    }
    
    if (iter == retval.start_iter) {
        // we didn't consume any input. (Except maybe spaces).
        // So just signal the end. Otherwise any outer loop
        // will spin forever.
        return token::mkend(end);
    }
    
    if (retval.lexeme == "var" )
        retval.toktype = tokVar;
    else if (retval.lexeme == "func" )
        retval.toktype = tokFunc;
    else
        retval.toktype = tokIdent;
        
    retval.end_iter = iter;

    
    return retval;
}